

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O0

void __thiscall DOMTest::findTestNodes(DOMTest *this,DOMDocument *document)

{
  undefined4 uVar1;
  DOMElement *local_58;
  DOMElement *local_30;
  int local_24;
  int nodeCount;
  DOMNode *node;
  DOMDocument *document_local;
  DOMTest *this_local;
  
  local_30 = (DOMElement *)0x0;
  if (document != (DOMDocument *)0x0) {
    local_30 = (DOMElement *)(document + 0x18);
  }
  local_24 = 0;
  while (local_30 != (DOMElement *)0x0 && local_24 < 0xc) {
    uVar1 = (**(code **)(*(long *)local_30 + 0x20))();
    switch(uVar1) {
    case 1:
      if (testElementNode == (DOMElement *)0x0) {
        testElementNode = local_30;
        local_24 = local_24 + 1;
      }
      break;
    case 2:
      if (testAttributeNode == (DOMAttr *)0x0) {
        testAttributeNode = (DOMAttr *)local_30;
        local_24 = local_24 + 1;
      }
      break;
    case 3:
      if (testTextNode == (DOMText *)0x0) {
        testTextNode = (DOMText *)local_30;
        local_24 = local_24 + 1;
      }
      break;
    case 4:
      if (testCDATASectionNode == (DOMCDATASection *)0x0) {
        testCDATASectionNode = (DOMCDATASection *)local_30;
        local_24 = local_24 + 1;
      }
      break;
    case 5:
      if (testEntityReferenceNode == (DOMEntityReference *)0x0) {
        testEntityReferenceNode = (DOMEntityReference *)local_30;
        local_24 = local_24 + 1;
      }
      break;
    case 6:
      if (testEntityNode == (DOMEntity *)0x0) {
        testEntityNode = (DOMEntity *)local_30;
        local_24 = local_24 + 1;
      }
      break;
    case 7:
      if (testProcessingInstructionNode == (DOMProcessingInstruction *)0x0) {
        testProcessingInstructionNode = (DOMProcessingInstruction *)local_30;
        local_24 = local_24 + 1;
      }
      break;
    case 8:
      if (testCommentNode == (DOMComment *)0x0) {
        testCommentNode = (DOMComment *)local_30;
        local_24 = local_24 + 1;
      }
      break;
    case 9:
      if (testDocumentNode == (DOMDocument *)0x0) {
        if (local_30 == (DOMElement *)0x0) {
          local_58 = (DOMElement *)0x0;
        }
        else {
          local_58 = local_30 + -0x18;
        }
        testDocumentNode = (DOMDocument *)local_58;
        local_24 = local_24 + 1;
      }
      break;
    case 10:
      if (testDocumentTypeNode == (DOMDocumentType *)0x0) {
        testDocumentTypeNode = (DOMDocumentType *)local_30;
        local_24 = local_24 + 1;
      }
      break;
    case 0xb:
      if (testDocumentFragmentNode == (DOMDocumentFragment *)0x0) {
        testDocumentFragmentNode = (DOMDocumentFragment *)local_30;
        local_24 = local_24 + 1;
      }
      break;
    case 0xc:
      if (testNotationNode == (DOMNotation *)0x0) {
        testNotationNode = (DOMNotation *)local_30;
        local_24 = local_24 + 1;
      }
    }
  }
  return;
}

Assistant:

void DOMTest::findTestNodes(DOMDocument* document) {
    DOMNode* node = document;
    int nodeCount = 0;

    // Walk the tree until you find and assign all node types needed that exist.
    while (node != 0 && nodeCount < 12)
    {

        switch (node->getNodeType())
    {
        case DOMNode::ELEMENT_NODE :
            if (testElementNode == 0) {testElementNode = (DOMElement*)node; nodeCount++;}
            break;
        case DOMNode::ATTRIBUTE_NODE :
            if (testAttributeNode == 0) {testAttributeNode = (DOMAttr*)node; nodeCount++;}
            break;
        case DOMNode::TEXT_NODE :
            if (testTextNode == 0) {testTextNode = (DOMText*)node; nodeCount++;}
            break;
        case DOMNode::CDATA_SECTION_NODE :
            if (testCDATASectionNode == 0) {testCDATASectionNode = (DOMCDATASection*)node; nodeCount++;}
            break;
        case DOMNode::ENTITY_REFERENCE_NODE :
            if (testEntityReferenceNode == 0) {testEntityReferenceNode = (DOMEntityReference*)node; nodeCount++;}
            break;
        case DOMNode::ENTITY_NODE :
            if (testEntityNode == 0) {testEntityNode = (DOMEntity*)node; nodeCount++;}
            break;
        case DOMNode::PROCESSING_INSTRUCTION_NODE :
            if (testProcessingInstructionNode == 0) {testProcessingInstructionNode = (DOMProcessingInstruction*)node; nodeCount++;}
            break;
        case DOMNode::COMMENT_NODE :
            if (testCommentNode == 0) {testCommentNode = (DOMComment*)node; nodeCount++;}
            break;
        case DOMNode::DOCUMENT_TYPE_NODE :
            if (testDocumentTypeNode == 0) {testDocumentTypeNode = (DOMDocumentType*)node; nodeCount++;}
            break;
        case DOMNode::DOCUMENT_FRAGMENT_NODE :
            if (testDocumentFragmentNode == 0) {testDocumentFragmentNode = (DOMDocumentFragment*)node; nodeCount++;}
            break;
        case DOMNode::NOTATION_NODE :
            if (testNotationNode == 0) {testNotationNode = (DOMNotation*)node; nodeCount++;}
            break;
        case DOMNode::DOCUMENT_NODE :
            if (testDocumentNode == 0) {testDocumentNode = (DOMDocument*)node; nodeCount++;}
            break;
        default:
            ;
    }// End of switch

    }   // End of while
}